

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

void __thiscall duckdb::IEJoinGlobalSourceState::Initialize(IEJoinGlobalSourceState *this)

{
  reference pvVar1;
  type this_00;
  idx_t iVar2;
  idx_t iVar3;
  type this_01;
  idx_t iVar4;
  size_t lhs;
  idx_t iVar5;
  size_t rhs;
  idx_t right_base;
  idx_t left_base;
  unique_lock<std::mutex> guard;
  
  ::std::unique_lock<std::mutex>::unique_lock
            (&guard,&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock);
  if (this->initialized == false) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
             ::get<true>(&this->gsink->tables,0);
    this_00 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator*(pvVar1);
    iVar2 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(this_00);
    left_base = 0;
    for (iVar5 = 0; iVar2 != iVar5; iVar5 = iVar5 + 1) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->left_bases,&left_base
                );
      iVar3 = PhysicalRangeJoin::GlobalSortedTable::BlockSize(this_00,iVar5);
      left_base = left_base + iVar3;
    }
    pvVar1 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
             ::get<true>(&this->gsink->tables,1);
    this_01 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator*(pvVar1);
    iVar5 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(this_01);
    right_base = 0;
    for (iVar3 = 0; iVar5 != iVar3; iVar3 = iVar3 + 1) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->right_bases,
                 &right_base);
      iVar4 = PhysicalRangeJoin::GlobalSortedTable::BlockSize(this_01,iVar3);
      right_base = right_base + iVar4;
    }
    if ((this_00->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0) {
      LOCK();
      (this->left_outers).super___atomic_base<unsigned_long>._M_i = iVar2;
      UNLOCK();
    }
    if ((this_01->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0) {
      LOCK();
      (this->right_outers).super___atomic_base<unsigned_long>._M_i = iVar5;
      UNLOCK();
    }
    this->initialized = true;
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void Initialize() {
		auto guard = Lock();
		if (initialized) {
			return;
		}

		// Compute the starting row for reach block
		// (In theory these are all the same size, but you never know...)
		auto &left_table = *gsink.tables[0];
		const auto left_blocks = left_table.BlockCount();
		idx_t left_base = 0;

		for (size_t lhs = 0; lhs < left_blocks; ++lhs) {
			left_bases.emplace_back(left_base);
			left_base += left_table.BlockSize(lhs);
		}

		auto &right_table = *gsink.tables[1];
		const auto right_blocks = right_table.BlockCount();
		idx_t right_base = 0;
		for (size_t rhs = 0; rhs < right_blocks; ++rhs) {
			right_bases.emplace_back(right_base);
			right_base += right_table.BlockSize(rhs);
		}

		// Outer join block counts
		if (left_table.found_match) {
			left_outers = left_blocks;
		}

		if (right_table.found_match) {
			right_outers = right_blocks;
		}

		// Ready for action
		initialized = true;
	}